

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall optimization::common_expr_del::Node::Node(Node *this)

{
  long in_RDI;
  int32_t in_stack_ffffffffffffffbc;
  Value *in_stack_ffffffffffffffc0;
  
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x179040);
  std::
  variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
  ::variant((variant<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
             *)0x17904e);
  NodeId::NodeId((NodeId *)(in_RDI + 0x20));
  mir::inst::Value::Value(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::list
            ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x179083);
  std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::list
            ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x179096);
  std::optional<mir::inst::Value>::optional((optional<mir::inst::Value> *)0x1790a4);
  std::
  set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  ::set((set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
         *)0x1790ba);
  std::
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1790cb);
  *(undefined1 *)(in_RDI + 0xf8) = 1;
  return;
}

Assistant:

Node() : is_leaf(true) {}